

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O3

int jpc_dec_process_qcc(jpc_dec_t *dec,jpc_ms_t *ms)

{
  uint_fast16_t uVar1;
  jpc_dec_tile_t *pjVar2;
  int iVar3;
  jpc_dec_cp_t *pjVar4;
  
  uVar1 = (ms->parms).sot.tileno;
  iVar3 = (int)uVar1;
  if (iVar3 < dec->numcomps) {
    if (dec->state == 0x10) {
      pjVar2 = dec->curtile;
      if (pjVar2 == (jpc_dec_tile_t *)0x0) {
        return -1;
      }
      if (0 < pjVar2->partno) {
        return -1;
      }
      pjVar4 = pjVar2->cp;
    }
    else {
      if (dec->state != 4) {
        return 0;
      }
      pjVar4 = dec->cp;
    }
    jpc_dec_cp_setfromqcx
              ((jpc_dec_cp_t *)(pjVar4->ccps + uVar1),(jpc_dec_ccp_t *)&(ms->parms).coc.compparms,
               (jpc_qcxcp_t *)0x8,iVar3);
    iVar3 = 0;
  }
  else {
    jas_eprintf("invalid component number in QCC marker segment\n");
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int jpc_dec_process_qcc(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_qcc_t *qcc = &ms->parms.qcc;
	jpc_dec_tile_t *tile;

	if (JAS_CAST(int, qcc->compno) >= dec->numcomps) {
		jas_eprintf("invalid component number in QCC marker segment\n");
		return -1;
	}
	switch (dec->state) {
	case JPC_MH:
		jpc_dec_cp_setfromqcc(dec->cp, qcc);
		break;
	case JPC_TPH:
		if (!(tile = dec->curtile)) {
			return -1;
		}
		if (tile->partno > 0) {
			return -1;
		}
		jpc_dec_cp_setfromqcc(tile->cp, qcc);
		break;
	}
	return 0;
}